

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrss.c
# Opt level: O2

size_t getMaxMemory(void)

{
  long lVar1;
  long lVar2;
  
  lVar1 = sysconf(0x55);
  lVar2 = sysconf(0x1e);
  return lVar2 * lVar1;
}

Assistant:

size_t
getMaxMemory()
{
#if defined(_WIN32)
    MEMORYSTATUSEX status;
    status.dwLength = sizeof(status);
    GlobalMemoryStatusEx(&status);
    return status.ullTotalPhys;
#else
    long pages = sysconf(_SC_PHYS_PAGES);
    long page_size = sysconf(_SC_PAGE_SIZE);
    return pages * page_size;
#endif
}